

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::CleanupCompaction(DBImpl *this,CompactionState *compact)

{
  long lVar1;
  void *pvVar2;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *psVar3;
  void *in_RSI;
  long in_FS_OFFSET;
  Output *out;
  size_t i;
  CompactionState *in_stack_ffffffffffffffa8;
  key_type *in_stack_ffffffffffffffb0;
  TableBuilder *in_stack_ffffffffffffffb8;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *this_00;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  port::Mutex::AssertHeld((Mutex *)in_stack_ffffffffffffffa8);
  if (*(long *)((long)in_RSI + 0x30) == 0) {
    if (*(long *)((long)in_RSI + 0x28) != 0) {
      __assert_fail("compact->outfile == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                    ,0x312,"void leveldb::DBImpl::CleanupCompaction(CompactionState *)");
    }
  }
  else {
    TableBuilder::Abandon((TableBuilder *)in_stack_ffffffffffffffa8);
    pvVar2 = *(void **)((long)in_RSI + 0x30);
    if (pvVar2 != (void *)0x0) {
      TableBuilder::~TableBuilder(in_stack_ffffffffffffffb8);
      operator_delete(pvVar2,8);
    }
  }
  if (*(long **)((long)in_RSI + 0x28) != (long *)0x0) {
    (**(code **)(**(long **)((long)in_RSI + 0x28) + 8))();
  }
  local_20 = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)0x0;
  while (this_00 = local_20,
        psVar3 = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 std::
                 vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                 ::size((vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                         *)in_stack_ffffffffffffffa8), this_00 < psVar3) {
    std::
    vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
    ::operator[]((vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                  *)this_00,(size_type)in_stack_ffffffffffffffb0);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::erase
              (this_00,in_stack_ffffffffffffffb0);
    local_20 = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &(local_20->_M_t)._M_impl.field_0x1;
  }
  if (in_RSI != (void *)0x0) {
    CompactionState::~CompactionState(in_stack_ffffffffffffffa8);
    operator_delete(in_RSI,0x40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void DBImpl::CleanupCompaction(CompactionState* compact) {
  mutex_.AssertHeld();
  if (compact->builder != nullptr) {
    // May happen if we get a shutdown call in the middle of compaction
    compact->builder->Abandon();
    delete compact->builder;
  } else {
    assert(compact->outfile == nullptr);
  }
  delete compact->outfile;
  for (size_t i = 0; i < compact->outputs.size(); i++) {
    const CompactionState::Output& out = compact->outputs[i];
    pending_outputs_.erase(out.number);
  }
  delete compact;
}